

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.hpp
# Opt level: O0

TypedDeleter<LLVMBC::BasicBlock> * __thiscall
LLVMBC::LLVMContext::
construct_trivial<LLVMBC::LLVMContext::TypedDeleter<LLVMBC::BasicBlock>,LLVMBC::BasicBlock*&>
          (LLVMContext *this,BasicBlock **u)

{
  TypedDeleter<LLVMBC::BasicBlock> *this_00;
  TypedDeleter<LLVMBC::BasicBlock> *t;
  TypedDeleter<LLVMBC::BasicBlock> *mem;
  BasicBlock **u_local;
  LLVMContext *this_local;
  
  this_00 = (TypedDeleter<LLVMBC::BasicBlock> *)allocate(this,0x10,8);
  if (this_00 == (TypedDeleter<LLVMBC::BasicBlock> *)0x0) {
    std::terminate();
  }
  TypedDeleter<LLVMBC::BasicBlock>::TypedDeleter(this_00,*u);
  return this_00;
}

Assistant:

T *construct_trivial(U &&... u)
	{
		T *mem = static_cast<T *>(allocate(sizeof(T), alignof(T)));
		if (!mem)
			std::terminate();
		T *t = new (mem) T(std::forward<U>(u)...);
		return t;
	}